

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlGrowNsCache(xmlNsCache **cache,int *capacity)

{
  xmlNsCache *pxVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = *capacity;
  if (iVar2 < 1) {
    uVar4 = 10;
  }
  else {
    uVar4 = 0xffffffff;
    if (iVar2 < 1000000000) {
      uVar3 = iVar2 + 1U >> 1;
      uVar4 = uVar3 + iVar2;
      if ((int)(1000000000 - uVar3) < iVar2) {
        uVar4 = 1000000000;
      }
    }
  }
  iVar2 = -1;
  if ((-1 < (int)uVar4) &&
     (pxVar1 = (xmlNsCache *)(*xmlRealloc)(*cache,(ulong)uVar4 << 4), pxVar1 != (xmlNsCache *)0x0))
  {
    *cache = pxVar1;
    *capacity = uVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlGrowNsCache(xmlNsCache **cache, int *capacity) {
    xmlNsCache *tmp;
    int newSize;

    newSize = xmlGrowCapacity(*capacity, sizeof(tmp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(*cache, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);
    *cache = tmp;
    *capacity = newSize;

    return(0);
}